

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

string * __thiscall
VulkanHppGenerator::combineDataTypes
          (string *__return_storage_ptr__,VulkanHppGenerator *this,
          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          *vectorParams,vector<unsigned_long,_std::allocator<unsigned_long>_> *returnParams,
          bool enumerating,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dataTypes,CommandFlavourFlags flavourFlags,bool raii)

{
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  pointer pbVar3;
  pointer pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  size_t sVar6;
  _Rb_tree_node_base *p_Var7;
  bool bVar8;
  size_type __n;
  byte bVar9;
  int iVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  _Base_ptr p_Var12;
  long lVar13;
  _Base_ptr p_Var14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  size_type __n_00;
  _Base_ptr p_Var16;
  pointer puVar17;
  size_type __n_01;
  undefined8 uVar18;
  ulong uVar19;
  string *this_00;
  byte bVar20;
  _Base_ptr p_Var21;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  modifiedDataTypes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string *local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  long *local_b8;
  size_type local_b0;
  long local_a8 [2];
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __n_01 = (long)(dataTypes->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(dataTypes->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5;
  if (__n_01 != (long)(returnParams->
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(returnParams->
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 3) {
    __assert_fail("dataTypes.size() == returnParams.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x585,
                  "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                 );
  }
  local_158 = __return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_110,__n_01,(allocator_type *)&local_1d8);
  puVar17 = (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar17) {
    p_Var1 = &(vectorParams->_M_t)._M_impl.super__Rb_tree_header;
    bVar9 = (flavourFlags.m_mask & 8) >> 3 | raii;
    uVar19 = 0;
    local_98 = vectorParams;
    do {
      p_Var12 = (vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var12 == (_Base_ptr)0x0) {
LAB_0013a14c:
        pbVar3 = (dataTypes->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pcVar4 = pbVar3[uVar19]._M_dataplus._M_p;
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1d8,pcVar4,pcVar4 + pbVar3[uVar19]._M_string_length);
        bVar8 = false;
        bVar20 = 0;
      }
      else {
        uVar2 = puVar17[uVar19];
        p_Var14 = &p_Var1->_M_header;
        do {
          if (*(ulong *)(p_Var12 + 1) >= uVar2) {
            p_Var14 = p_Var12;
          }
          p_Var12 = (&p_Var12->_M_left)[*(ulong *)(p_Var12 + 1) < uVar2];
        } while (p_Var12 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var14 == p_Var1) ||
           ((byte)(uVar2 < *(ulong *)(p_Var14 + 1) | (flavourFlags.m_mask & 4) >> 2) == 1))
        goto LAB_0013a14c;
        std::operator+(&local_d8,"std::vector<",
                       (dataTypes->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar19);
        if (bVar9 == 0) {
          pbVar3 = (dataTypes->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_b8 = local_a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b8,"VULKAN_HPP_NAMESPACE::","");
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          pcVar4 = pbVar3[uVar19]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_130,pcVar4,pcVar4 + pbVar3[uVar19]._M_string_length);
          __n = local_b0;
          __n_00 = local_130._M_string_length;
          if (local_b0 <= local_130._M_string_length) {
            __n_00 = local_b0;
          }
          if ((local_b0 <= local_130._M_string_length) &&
             ((__n_00 == 0 ||
              (iVar10 = bcmp(local_130._M_dataplus._M_p,local_b8,__n_00), iVar10 == 0)))) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                      (&local_130,0,__n);
          }
          anon_unknown.dwarf_18c225::startUpperCase(&local_70,&local_130);
          pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace(&local_70,0,0,", ",2);
          local_f8._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
          paVar15 = &pbVar11->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p == paVar15) {
            local_f8.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
            local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          }
          else {
            local_f8.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
          }
          local_f8._M_string_length = pbVar11->_M_string_length;
          (pbVar11->_M_dataplus)._M_p = (pointer)paVar15;
          pbVar11->_M_string_length = 0;
          (pbVar11->field_2)._M_local_buf[0] = '\0';
          pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&local_f8,"Allocator>");
          local_150._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
          paVar15 = &pbVar11->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p == paVar15) {
            local_150.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
            local_150.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
            local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          }
          else {
            local_150.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
          }
          local_150._M_string_length = pbVar11->_M_string_length;
          (pbVar11->_M_dataplus)._M_p = (pointer)paVar15;
          pbVar11->_M_string_length = 0;
          (pbVar11->field_2)._M_local_buf[0] = '\0';
        }
        else {
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,">","");
        }
        uVar18 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          uVar18 = local_d8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar18 < local_150._M_string_length + local_d8._M_string_length) {
          uVar18 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            uVar18 = local_150.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar18 < local_150._M_string_length + local_d8._M_string_length)
          goto LAB_0013a509;
          pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace(&local_150,0,0,local_d8._M_dataplus._M_p,local_d8._M_string_length);
        }
        else {
LAB_0013a509:
          pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_append(&local_d8,local_150._M_dataplus._M_p,local_150._M_string_length);
        }
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar11->_M_dataplus)._M_p;
        paVar15 = &pbVar11->field_2;
        if (paVar5 == paVar15) {
          local_1d8.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_1d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
        }
        else {
          local_1d8.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_1d8._M_dataplus._M_p = (pointer)paVar5;
        }
        local_1d8._M_string_length = pbVar11->_M_string_length;
        (pbVar11->_M_dataplus)._M_p = (pointer)paVar15;
        pbVar11->_M_string_length = 0;
        paVar15->_M_local_buf[0] = '\0';
        bVar8 = true;
        bVar20 = bVar9 ^ 1;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (local_110.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar19,&local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if ((bVar8) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2)) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      vectorParams = local_98;
      if (bVar20 != 0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        if (local_b8 != local_a8) {
          operator_delete(local_b8,local_a8[0] + 1);
        }
      }
      if ((bVar8) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2)) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      uVar19 = uVar19 + 1;
      puVar17 = (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar19 < (ulong)((long)(returnParams->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)puVar17 >> 3
                             ));
  }
  pbVar3 = local_110.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = local_158;
  (local_158->_M_dataplus)._M_p = (pointer)&local_158->field_2;
  local_158->_M_string_length = 0;
  (local_158->field_2)._M_local_buf[0] = '\0';
  switch((long)local_110.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)local_110.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 5) {
  case 0:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (local_158,0,0,"void",4);
    goto LAB_0013a5f4;
  case 1:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (local_158,
               local_110.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    goto LAB_0013a5f4;
  case 2:
    if (enumerating) {
      p_Var12 = (vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var12 == (_Base_ptr)0x0) {
LAB_0013ae27:
        __assert_fail("!enumerating || ( vectorParams.contains( returnParams[1] ) && ( vectorParams.find( returnParams[1] )->second.lenParam == returnParams[0] ) )"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x599,
                      "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                     );
      }
      p_Var21 = &(vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_header;
      uVar19 = puVar17[1];
      p_Var16 = p_Var21;
      p_Var14 = p_Var12;
      do {
        if (*(ulong *)(p_Var14 + 1) >= uVar19) {
          p_Var16 = p_Var14;
        }
        p_Var14 = (&p_Var14->_M_left)[*(ulong *)(p_Var14 + 1) < uVar19];
      } while (p_Var14 != (_Base_ptr)0x0);
      if ((p_Var16 == p_Var21) || (p_Var14 = p_Var21, uVar19 < *(ulong *)(p_Var16 + 1)))
      goto LAB_0013ae27;
      do {
        if (*(ulong *)(p_Var12 + 1) >= uVar19) {
          p_Var14 = p_Var12;
        }
        p_Var12 = (&p_Var12->_M_left)[*(ulong *)(p_Var12 + 1) < uVar19];
      } while (p_Var12 != (_Base_ptr)0x0);
      if ((p_Var14 != p_Var21) && (*(ulong *)(p_Var14 + 1) <= uVar19)) {
        p_Var21 = p_Var14;
      }
      if (p_Var21[1]._M_parent != (_Base_ptr)*puVar17) goto LAB_0013ae27;
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      pcVar4 = local_110.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,pcVar4,
                 pcVar4 + local_110.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
    }
    else {
      std::operator+(&local_178,"std::pair<",
                     local_110.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
      pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_178,", ");
      local_1b8._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
      paVar15 = &pbVar11->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p == paVar15) {
        local_1b8.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_1b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      }
      else {
        local_1b8.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      }
      local_1b8._M_string_length = pbVar11->_M_string_length;
      (pbVar11->_M_dataplus)._M_p = (pointer)paVar15;
      pbVar11->_M_string_length = 0;
      (pbVar11->field_2)._M_local_buf[0] = '\0';
      pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append(&local_1b8,
                          local_110.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,
                          local_110.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
      local_198._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
      paVar15 = &pbVar11->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p == paVar15) {
        local_198.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_198.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      }
      else {
        local_198.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      }
      local_198._M_string_length = pbVar11->_M_string_length;
      (pbVar11->_M_dataplus)._M_p = (pointer)paVar15;
      pbVar11->_M_string_length = 0;
      (pbVar11->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_198,">");
      combineDataTypes();
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_00,&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if (enumerating) goto LAB_0013a5f4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
LAB_0013add1:
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
LAB_0013adde:
    local_50.field_2._M_allocated_capacity = local_178.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_178._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p == &local_178.field_2) goto LAB_0013a5f4;
    break;
  case 3:
    sVar6 = (vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    if (sVar6 == 2) {
      if (!enumerating) {
        __assert_fail("enumerating",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x5a9,
                      "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                     );
      }
      p_Var7 = (vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((((*(unsigned_long *)(p_Var7 + 1) != puVar17[1]) ||
           (p_Var12 = p_Var7[1]._M_parent, p_Var12 != (_Base_ptr)*puVar17)) ||
          (lVar13 = std::_Rb_tree_increment(p_Var7), *(unsigned_long *)(lVar13 + 0x20) != puVar17[2]
          )) || (lVar13 = std::_Rb_tree_increment(p_Var7), *(_Base_ptr *)(lVar13 + 0x28) != p_Var12)
         ) {
        __assert_fail("( vectorParams.begin()->first == returnParams[1] ) && ( vectorParams.begin()->second.lenParam == returnParams[0] ) && ( std::next( vectorParams.begin() )->first == returnParams[2] ) && ( std::next( vectorParams.begin() )->second.lenParam == returnParams[0] )"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x5ac,
                      "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                     );
      }
      std::operator+(&local_178,"std::pair<",pbVar3 + 1);
      pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_178,", ");
      local_1b8._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
      paVar15 = &pbVar11->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p == paVar15) {
        local_1b8.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_1b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      }
      else {
        local_1b8.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      }
      local_1b8._M_string_length = pbVar11->_M_string_length;
      (pbVar11->_M_dataplus)._M_p = (pointer)paVar15;
      pbVar11->_M_string_length = 0;
      (pbVar11->field_2)._M_local_buf[0] = '\0';
      pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append(&local_1b8,
                          local_110.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p,
                          local_110.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length);
      local_198._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
      paVar15 = &pbVar11->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p == paVar15) {
        local_198.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_198.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      }
      else {
        local_198.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      }
      local_198._M_string_length = pbVar11->_M_string_length;
      (pbVar11->_M_dataplus)._M_p = (pointer)paVar15;
      pbVar11->_M_string_length = 0;
      (pbVar11->field_2)._M_local_buf[0] = '\0';
      pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_198,">");
LAB_0013ad46:
      local_1d8._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
      paVar15 = &pbVar11->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p == paVar15) {
        local_1d8.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_1d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      }
      else {
        local_1d8.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      }
      local_1d8._M_string_length = pbVar11->_M_string_length;
      (pbVar11->_M_dataplus)._M_p = (pointer)paVar15;
      pbVar11->_M_string_length = 0;
      (pbVar11->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (this_00,&local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) goto LAB_0013add1;
      goto LAB_0013adde;
    }
    if (sVar6 == 1) {
      if (!enumerating) {
        __assert_fail("enumerating",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x5a4,
                      "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                     );
      }
      p_Var12 = (vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((*(unsigned_long *)(p_Var12 + 1) != puVar17[2]) ||
         (p_Var12[1]._M_parent != (_Base_ptr)puVar17[1])) {
        __assert_fail("( vectorParams.begin()->first == returnParams[2] ) && ( vectorParams.begin()->second.lenParam == returnParams[1] )"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x5a5,
                      "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                     );
      }
      std::operator+(&local_178,"std::pair<",
                     local_110.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
      pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_178,", ");
      local_1b8._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
      paVar15 = &pbVar11->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p == paVar15) {
        local_1b8.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_1b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      }
      else {
        local_1b8.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      }
      local_1b8._M_string_length = pbVar11->_M_string_length;
      (pbVar11->_M_dataplus)._M_p = (pointer)paVar15;
      pbVar11->_M_string_length = 0;
      (pbVar11->field_2)._M_local_buf[0] = '\0';
      pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append(&local_1b8,
                          local_110.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p,
                          local_110.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length);
      local_198._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
      paVar15 = &pbVar11->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p == paVar15) {
        local_198.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_198.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      }
      else {
        local_198.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      }
      local_198._M_string_length = pbVar11->_M_string_length;
      (pbVar11->_M_dataplus)._M_p = (pointer)paVar15;
      pbVar11->_M_string_length = 0;
      (pbVar11->field_2)._M_local_buf[0] = '\0';
      pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_198,">");
      goto LAB_0013ad46;
    }
    if (sVar6 != 0) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x5af,
                    "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                   );
    }
    if (enumerating) {
      __assert_fail("!enumerating",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x5a0,
                    "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                   );
    }
    std::operator+(&local_50,"std::tuple<",
                   local_110.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_50,", ");
    local_90._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
    paVar15 = &pbVar11->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == paVar15) {
      local_90.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    }
    local_90._M_string_length = pbVar11->_M_string_length;
    (pbVar11->_M_dataplus)._M_p = (pointer)paVar15;
    pbVar11->_M_string_length = 0;
    (pbVar11->field_2)._M_local_buf[0] = '\0';
    pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_90,
                        local_110.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,
                        local_110.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
    local_178._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
    paVar15 = &pbVar11->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p == paVar15) {
      local_178.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_178.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    }
    else {
      local_178.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    }
    local_178._M_string_length = pbVar11->_M_string_length;
    (pbVar11->_M_dataplus)._M_p = (pointer)paVar15;
    pbVar11->_M_string_length = 0;
    (pbVar11->field_2)._M_local_buf[0] = '\0';
    pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_178,", ");
    local_1b8._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
    paVar15 = &pbVar11->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p == paVar15) {
      local_1b8.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_1b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    }
    local_1b8._M_string_length = pbVar11->_M_string_length;
    (pbVar11->_M_dataplus)._M_p = (pointer)paVar15;
    pbVar11->_M_string_length = 0;
    (pbVar11->field_2)._M_local_buf[0] = '\0';
    pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_1b8,
                        local_110.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p,
                        local_110.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length);
    local_198._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
    paVar15 = &pbVar11->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p == paVar15) {
      local_198.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_198.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    }
    else {
      local_198.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    }
    local_198._M_string_length = pbVar11->_M_string_length;
    (pbVar11->_M_dataplus)._M_p = (pointer)paVar15;
    pbVar11->_M_string_length = 0;
    (pbVar11->field_2)._M_local_buf[0] = '\0';
    pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_198,">");
    local_1d8._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
    paVar15 = &pbVar11->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p == paVar15) {
      local_1d8.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_1d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    }
    local_1d8._M_string_length = pbVar11->_M_string_length;
    (pbVar11->_M_dataplus)._M_p = (pointer)paVar15;
    pbVar11->_M_string_length = 0;
    (pbVar11->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (local_158,&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    this_00 = local_158;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_0013a5f4;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x5b2,
                  "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                 );
  }
  operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
LAB_0013a5f4:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_110);
  return this_00;
}

Assistant:

std::string VulkanHppGenerator::combineDataTypes( std::map<size_t, VectorParamData> const & vectorParams,
                                                  std::vector<size_t> const &               returnParams,
                                                  bool                                      enumerating,
                                                  std::vector<std::string> const &          dataTypes,
                                                  CommandFlavourFlags                       flavourFlags,
                                                  bool                                      raii ) const
{
  assert( dataTypes.size() == returnParams.size() );

  std::vector<std::string> modifiedDataTypes( dataTypes.size() );
  for ( size_t i = 0; i < returnParams.size(); ++i )
  {
    auto vectorParamIt   = vectorParams.find( returnParams[i] );
    modifiedDataTypes[i] = ( vectorParamIt == vectorParams.end() || ( flavourFlags & CommandFlavourFlagBits::singular ) )
                           ? dataTypes[i]
                           : ( "std::vector<" + dataTypes[i] +
                               ( raii || ( flavourFlags & CommandFlavourFlagBits::unique )
                                   ? ">"
                                   : ( ", " + startUpperCase( stripPrefix( dataTypes[i], "VULKAN_HPP_NAMESPACE::" ) ) + "Allocator>" ) ) );
  }

  std::string combinedType;
  switch ( modifiedDataTypes.size() )
  {
    case 0: combinedType = "void"; break;
    case 1: combinedType = modifiedDataTypes[0]; break;
    case 2:
      assert( !enumerating || ( vectorParams.contains( returnParams[1] ) && ( vectorParams.find( returnParams[1] )->second.lenParam == returnParams[0] ) ) );
      combinedType = enumerating ? modifiedDataTypes[1] : ( "std::pair<" + modifiedDataTypes[0] + ", " + modifiedDataTypes[1] + ">" );
      break;
    case 3:
      switch ( vectorParams.size() )
      {
        case 0:
          assert( !enumerating );
          combinedType = "std::tuple<" + modifiedDataTypes[0] + ", " + modifiedDataTypes[1] + ", " + modifiedDataTypes[2] + ">";
          break;
        case 1:
          assert( enumerating );
          assert( ( vectorParams.begin()->first == returnParams[2] ) && ( vectorParams.begin()->second.lenParam == returnParams[1] ) );
          combinedType = "std::pair<" + modifiedDataTypes[0] + ", " + modifiedDataTypes[2] + ">";
          break;
        case 2:
          assert( enumerating );
          assert( ( vectorParams.begin()->first == returnParams[1] ) && ( vectorParams.begin()->second.lenParam == returnParams[0] ) &&
                  ( std::next( vectorParams.begin() )->first == returnParams[2] ) &&
                  ( std::next( vectorParams.begin() )->second.lenParam == returnParams[0] ) );
          combinedType = "std::pair<" + modifiedDataTypes[1] + ", " + modifiedDataTypes[2] + ">";
          break;
        default: assert( false ); break;
      }
      break;
    default: assert( false ); break;
  }
  return combinedType;
}